

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void AddNewRoom(void)

{
  Admin *this;
  char *__s;
  Room *this_00;
  int access;
  int id;
  
  __s = (char *)operator_new__(100);
  std::operator<<((ostream *)&std::cout,"Room Name : \n");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,__s);
  std::operator<<((ostream *)&std::cout,"Room number : \n");
  std::istream::operator>>((istream *)&std::cin,&id);
  std::operator<<((ostream *)&std::cout,"Standard Access level for Room : \n");
  std::istream::operator>>((istream *)&std::cin,&access);
  this = root;
  this_00 = (Room *)operator_new(0x28);
  Room::Room(this_00,__s,id,access);
  Admin::addNewRoom(this,this_00);
  return;
}

Assistant:

void AddNewRoom(){
    char* name = new char[100];
    cout<<"Room Name : \n";
    cin>>name;
    int id;
    cout<<"Room number : \n";
    cin>>id;
    int access;
    cout<<"Standard Access level for Room : \n";
    cin>>access;
    root->addNewRoom(new Room(name,id,access));
}